

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_source_filling_magic_number.cc
# Opt level: O0

int __thiscall sptk::InputSourceFillingMagicNumber::Proceed(InputSourceFillingMagicNumber *this)

{
  value_type vVar1;
  int iVar2;
  bool bVar3;
  byte bVar4;
  reference this_00;
  reference pvVar5;
  reference this_01;
  reference pvVar6;
  size_type sVar7;
  long *in_RDI;
  double dVar8;
  int j;
  double value;
  double slope;
  double left;
  double right;
  int i_1;
  iterator itr;
  int i;
  vector<double,_std::allocator<double>_> curr_data;
  int data_size;
  _Self *in_stack_fffffffffffffe28;
  _Self *in_stack_fffffffffffffe30;
  undefined4 in_stack_fffffffffffffe40;
  int in_stack_fffffffffffffe44;
  anon_class_8_1_8991fb9c_for__M_pred in_stack_fffffffffffffe48;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe50;
  __normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_>
  in_stack_fffffffffffffe58;
  int local_11c;
  _Self *local_118;
  _Self *local_c8;
  int local_b4;
  _Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>
  local_90;
  int local_6c;
  undefined4 local_68;
  vector<double,_std::allocator<double>_> local_58;
  int local_3c;
  double *local_38;
  double *local_28;
  double *local_20;
  double *local_18;
  int local_4;
  
  bVar3 = std::
          deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::empty((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)0x106a85);
  if (!bVar3) {
    std::
    deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::front((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    local_20 = (double *)
               std::vector<double,_std::allocator<double>_>::begin
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe28);
    std::
    deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::front((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    local_28 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe28);
    local_18 = (double *)
               std::
               find_if<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>,sptk::InputSourceFillingMagicNumber::Proceed()::__0>
                         (in_stack_fffffffffffffe58,in_stack_fffffffffffffe50,
                          in_stack_fffffffffffffe48);
    std::
    deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::front((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
             *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
    local_38 = (double *)
               std::vector<double,_std::allocator<double>_>::end
                         ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe28);
    bVar3 = __gnu_cxx::operator==
                      ((__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffe30,
                       (__normal_iterator<double_*,_std::vector<double,_std::allocator<double>_>_> *
                       )in_stack_fffffffffffffe28);
    if (bVar3) {
      return 2;
    }
  }
  local_3c = (**(code **)(*in_RDI + 0x10))();
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x106b70);
  bVar4 = (**(code **)(*(long *)in_RDI[2] + 0x20))((long *)in_RDI[2],&local_58);
  if ((bVar4 & 1) == 0) {
    bVar3 = std::
            deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::empty((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                     *)0x106ba9);
    if (bVar3) {
      local_4 = 0;
    }
    else {
      for (local_6c = 0; local_6c < local_3c; local_6c = local_6c + 1) {
        dVar8 = (double)in_RDI[1];
        this_00 = std::
                  deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::front((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
        pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)local_6c);
        if ((dVar8 == *pvVar5) && (!NAN(dVar8) && !NAN(*pvVar5))) {
          dVar8 = (double)in_RDI[1];
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                              (long)local_6c);
          if ((dVar8 == *pvVar5) && (!NAN(dVar8) && !NAN(*pvVar5))) {
            local_4 = 1;
            goto LAB_001070dd;
          }
          std::
          deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ::begin((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)in_stack_fffffffffffffe28);
          while( true ) {
            std::
            deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::end((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                   *)in_stack_fffffffffffffe28);
            bVar3 = std::operator!=(in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
            if (!bVar3) break;
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                                (long)local_6c);
            vVar1 = *pvVar5;
            this_01 = std::
                      _Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>
                      ::operator*(&local_90);
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               (this_01,(long)local_6c);
            *pvVar5 = vVar1;
            std::
            _Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>
            ::operator++(in_stack_fffffffffffffe30);
          }
        }
      }
      local_4 = 2;
    }
  }
  else {
    for (local_b4 = 0; local_b4 < local_3c; local_b4 = local_b4 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[](&local_58,(long)local_b4);
      local_118 = (_Self *)*pvVar5;
      if (((double)in_RDI[1] != (double)local_118) ||
         (NAN((double)in_RDI[1]) || NAN((double)local_118))) {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11),(long)local_b4);
        if (*pvVar6 != 0) {
          sVar7 = std::
                  deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                  ::size((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          *)0x106e1d);
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11),(long)local_b4);
          if ((int)sVar7 == *pvVar6) {
            in_stack_fffffffffffffe50._M_current = (double *)in_RDI[1];
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                                (long)local_b4);
            if (((double)in_stack_fffffffffffffe50._M_current != *pvVar5) ||
               (local_c8 = local_118,
               NAN((double)in_stack_fffffffffffffe50._M_current) || NAN(*pvVar5))) {
              pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                                 ((vector<double,_std::allocator<double>_> *)(in_RDI + 0xe),
                                  (long)local_b4);
              local_c8 = (_Self *)*pvVar5;
            }
          }
          else {
            std::
            deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::rbegin((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_stack_fffffffffffffe58._M_current);
            std::vector<int,_std::allocator<int>_>::operator[]
                      ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11),(long)local_b4);
            std::
            reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
            ::operator+((reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
                         *)in_stack_fffffffffffffe58._M_current,
                        (difference_type)in_stack_fffffffffffffe50._M_current);
            in_stack_fffffffffffffe58._M_current =
                 (double *)
                 std::
                 reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
                 ::operator*((reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
                              *)CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)
                                in_stack_fffffffffffffe58._M_current,(long)local_b4);
            local_c8 = (_Self *)*pvVar5;
          }
          dVar8 = (double)local_c8 - (double)local_118;
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11),(long)local_b4);
          iVar2 = *pvVar6;
          local_11c = 0;
          while (in_stack_fffffffffffffe44 = local_11c,
                pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                                   ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11),
                                    (long)local_b4), in_stack_fffffffffffffe44 < *pvVar6) {
            local_118 = (_Self *)((double)local_118 + dVar8 / (double)(iVar2 + 1));
            in_stack_fffffffffffffe30 = local_118;
            std::
            deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            ::rbegin((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      *)in_stack_fffffffffffffe58._M_current);
            std::
            reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
            ::operator+((reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
                         *)in_stack_fffffffffffffe58._M_current,
                        (difference_type)in_stack_fffffffffffffe50._M_current);
            in_stack_fffffffffffffe28 =
                 (_Self *)std::
                          reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
                          ::operator*((reverse_iterator<std::_Deque_iterator<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_&,_std::vector<double,_std::allocator<double>_>_*>_>
                                       *)CONCAT44(in_stack_fffffffffffffe44,
                                                  in_stack_fffffffffffffe40));
            pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                               ((vector<double,_std::allocator<double>_> *)in_stack_fffffffffffffe28
                                ,(long)local_b4);
            *pvVar5 = (value_type)in_stack_fffffffffffffe30;
            local_11c = local_11c + 1;
          }
          pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                             ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11),(long)local_b4);
          *pvVar6 = 0;
        }
      }
      else {
        pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                           ((vector<int,_std::allocator<int>_> *)(in_RDI + 0x11),(long)local_b4);
        *pvVar6 = *pvVar6 + 1;
      }
    }
    std::
    deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::push_back((deque<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                 *)in_stack_fffffffffffffe30,(value_type *)in_stack_fffffffffffffe28);
    local_4 = 3;
  }
LAB_001070dd:
  local_68 = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             CONCAT44(in_stack_fffffffffffffe44,in_stack_fffffffffffffe40));
  return local_4;
}

Assistant:

int InputSourceFillingMagicNumber::Proceed() {
  // If magic number is not in the front of queue, you can output the data.
  if (!queue_.empty()) {
    if (std::find_if(queue_.front().begin(), queue_.front().end(),
                     [this](double x) { return magic_number_ == x; }) ==
        queue_.front().end()) {
      return kGood;
    }
  }

  const int data_size(GetSize());

  // Load new data.
  std::vector<double> curr_data;
  if (!source_->Get(&curr_data)) {
    if (queue_.empty()) {
      return kExit;
    }
    for (int i(0); i < data_size; ++i) {
      if (magic_number_ == queue_.front()[i]) {
        if (magic_number_ == final_output_[i]) {
          // This means all the data is magic number.
          return kFail;
        }
        // Replace magic number with final output value.
        for (std::deque<std::vector<double> >::iterator itr(queue_.begin());
             itr != queue_.end(); ++itr) {
          (*itr)[i] = final_output_[i];
        }
      }
    }
    return kGood;
  }

  for (int i(0); i < data_size; ++i) {
    const double right(curr_data[i]);

    if (magic_number_ == right) {
      ++magic_number_region_[i];
    } else if (magic_number_region_[i]) {
      // Interpolate magic numbers.
      double left;
      if (static_cast<int>(queue_.size()) != magic_number_region_[i]) {
        left = (*(queue_.rbegin() + magic_number_region_[i]))[i];
      } else if (magic_number_ != final_output_[i]) {
        left = final_output_[i];
      } else {
        left = right;
      }
      const double slope((left - right) / (magic_number_region_[i] + 1));
      double value(right);
      for (int j(0); j < magic_number_region_[i]; ++j) {
        value += slope;
        (*(queue_.rbegin() + j))[i] = value;
      }
      magic_number_region_[i] = 0;
    }
  }
  queue_.push_back(curr_data);

  return kWait;
}